

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

CFinfo * amrex::FabArrayBase::TheCFinfo
                   (FabArrayBase *finefa,Geometry *finegm,IntVect *ng,bool include_periodic,
                   bool include_physbndry)

{
  bool bVar1;
  pointer ppVar2;
  CFinfo *pCVar3;
  byte in_CL;
  int *in_RDX;
  byte in_R8B;
  CFinfo *new_cfinfo;
  bool in_stack_0000008e;
  bool in_stack_0000008f;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_> it;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>_>
  er_it;
  CFinfo *in_stack_000000a8;
  BDKey *key;
  value_type *in_stack_fffffffffffffed8;
  multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>_>
  *in_stack_fffffffffffffee0;
  const_iterator in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  bool local_f9;
  pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*> local_f0;
  _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>
  local_d8 [3];
  CFinfo *local_c0;
  Box local_b4;
  _Self local_98;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>_>
  local_90;
  BDKey local_80;
  BDKey *local_70;
  byte local_62;
  byte local_61;
  int *local_60;
  int *local_40;
  IntVect *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_61 = in_CL & 1;
  local_62 = in_R8B & 1;
  local_60 = in_RDX;
  local_80 = getBDKey((FabArrayBase *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0))
  ;
  local_70 = &local_80;
  local_90 = std::
             multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>_>
             ::equal_range(in_stack_fffffffffffffee0,&in_stack_fffffffffffffed8->first);
  local_98._M_node = local_90.first._M_node;
  while( true ) {
    bVar1 = std::operator!=(&local_98,&local_90.second);
    if (!bVar1) {
      pCVar3 = (CFinfo *)operator_new(0xd8);
      CFinfo::CFinfo(in_stack_000000a8,(FabArrayBase *)er_it.second._M_node,
                     (Geometry *)er_it.first._M_node,(IntVect *)it._M_node,in_stack_0000008f,
                     in_stack_0000008e);
      pCVar3->m_nuse = 1;
      local_c0 = pCVar3;
      CacheStats::recordBuild((CacheStats *)pCVar3);
      CacheStats::recordUse((CacheStats *)m_CFinfo_stats);
      std::
      _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>
      ::_Rb_tree_const_iterator(local_d8,&local_90.second);
      std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>::
      pair<amrex::FabArrayBase::CFinfo_*&,_true>(&local_f0,local_70,&local_c0);
      std::
      multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>_>
      ::insert((multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>_>
                *)pCVar3,in_stack_fffffffffffffee8,in_stack_fffffffffffffed8);
      return local_c0;
    }
    std::
    _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>::
    operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>
                *)0x100fe15);
    bVar1 = BDKey::operator==((BDKey *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0)
                              ,(BDKey *)in_stack_fffffffffffffee8._M_node);
    local_f9 = false;
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>
                             *)0x100fe4c);
      pCVar3 = ppVar2->second;
      CFinfo::Domain((Geometry *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                     (IntVect *)in_stack_fffffffffffffee8._M_node,
                     SUB81((ulong)in_stack_fffffffffffffee0 >> 0x38,0),
                     SUB81((ulong)in_stack_fffffffffffffee0 >> 0x30,0));
      bVar1 = Box::operator==(&pCVar3->m_fine_domain,&local_b4);
      local_f9 = false;
      if (bVar1) {
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>
                               *)0x100febd);
        pCVar3 = ppVar2->second;
        in_stack_fffffffffffffee8._M_node = (_Base_ptr)&pCVar3->m_ng;
        local_40 = local_60;
        local_8 = local_60;
        local_c = 0;
        in_stack_fffffffffffffef7 = false;
        local_f9 = (bool)in_stack_fffffffffffffef7;
        local_38 = (IntVect *)in_stack_fffffffffffffee8._M_node;
        if (((IntVect *)in_stack_fffffffffffffee8._M_node)->vect[0] == *local_60) {
          local_18 = local_60;
          local_1c = 1;
          in_stack_fffffffffffffef7 = false;
          local_f9 = (bool)in_stack_fffffffffffffef7;
          if ((pCVar3->m_ng).vect[1] == local_60[1]) {
            local_28 = local_60;
            local_2c = 2;
            in_stack_fffffffffffffef7 = (pCVar3->m_ng).vect[2] == local_60[2];
            local_f9 = (bool)in_stack_fffffffffffffef7;
          }
        }
      }
    }
    if (local_f9 != false) break;
    std::
    _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>::
    operator++((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>
                *)in_stack_fffffffffffffee0);
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>
                         *)0x100ffbf);
  ppVar2->second->m_nuse = ppVar2->second->m_nuse + 1;
  CacheStats::recordUse((CacheStats *)m_CFinfo_stats);
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>
                         *)0x100ffee);
  return ppVar2->second;
}

Assistant:

const FabArrayBase::CFinfo&
FabArrayBase::TheCFinfo (const FabArrayBase& finefa,
                         const Geometry&     finegm,
                         const IntVect&      ng,
                         bool                include_periodic,
                         bool                include_physbndry)
{
    BL_PROFILE("FabArrayBase::TheCFinfo()");

    const BDKey& key = finefa.getBDKey();
    auto er_it = m_TheCrseFineCache.equal_range(key);
    for (auto it = er_it.first; it != er_it.second; ++it)
    {
        if (it->second->m_fine_bdk    == key                        &&
            it->second->m_fine_domain == CFinfo::Domain(finegm, ng,
                                                        include_periodic,
                                                        include_physbndry) &&
            it->second->m_ng          == ng)
        {
            ++(it->second->m_nuse);
            m_CFinfo_stats.recordUse();
            return *(it->second);
        }
    }

    // Have to build a new one
    CFinfo* new_cfinfo = new CFinfo(finefa, finegm, ng, include_periodic, include_physbndry);

#ifdef AMREX_MEM_PROFILING
    m_CFinfo_stats.bytes += new_cfinfo->bytes();
    m_CFinfo_stats.bytes_hwm = std::max(m_CFinfo_stats.bytes_hwm, m_CFinfo_stats.bytes);
#endif

    new_cfinfo->m_nuse = 1;
    m_CFinfo_stats.recordBuild();
    m_CFinfo_stats.recordUse();

    m_TheCrseFineCache.insert(er_it.second, CFinfoCache::value_type(key,new_cfinfo));

    return *new_cfinfo;
}